

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseCodeTree.cpp
# Opt level: O0

void __thiscall Indexing::ClauseCodeTree::ClauseMatcher::reset(ClauseMatcher *this)

{
  uint uVar1;
  size_t sVar2;
  long in_RDI;
  uint i;
  uint liCnt;
  uint uVar3;
  
  sVar2 = Lib::DArray<Indexing::CodeTree::LitInfo>::size
                    ((DArray<Indexing::CodeTree::LitInfo> *)(in_RDI + 0x18));
  uVar1 = (uint)sVar2;
  for (uVar3 = 0; uVar3 < uVar1; uVar3 = uVar3 + 1) {
    Lib::DArray<Indexing::CodeTree::LitInfo>::operator[]
              ((DArray<Indexing::CodeTree::LitInfo> *)(in_RDI + 0x18),(ulong)uVar3);
    CodeTree::LitInfo::dispose((LitInfo *)0x2f6f7c);
  }
  Lib::
  Stack<Lib::Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
  ::reset((Stack<Lib::Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
           *)CONCAT44(uVar1,uVar3));
  return;
}

Assistant:

void ClauseCodeTree::ClauseMatcher::reset()
{
  unsigned liCnt=lInfos.size();
  for(unsigned i=0;i<liCnt;i++) {
    lInfos[i].dispose();
  }
  lms.reset();

#if VDEBUG
  ASS_EQ(tree->_clauseMatcherCounter,1);
  tree->_clauseMatcherCounter--;
#endif
}